

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::
Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
::ParseValue(Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
             *this,string *value_)

{
  std::__cxx11::string::_M_assign((string *)&this->value);
  (this->super_PositionalBase).super_NamedBase.field_0x99 = 0;
  (this->super_PositionalBase).super_NamedBase.super_Base.matched = true;
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
                ready = false;
                matched = true;
            }